

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O2

FT_Error FT_Done_Face(FT_Face face)

{
  int iVar1;
  FT_Driver driver;
  FT_Memory memory;
  FT_ListNode pFVar2;
  FT_ListNode pFVar3;
  FT_ListNode pFVar4;
  FT_ListRec *pFVar5;
  FT_ListNode pFVar6;
  FT_Error FVar7;
  
  FVar7 = 0x23;
  if ((face != (FT_Face)0x0) && (driver = face->driver, driver != (FT_Driver)0x0)) {
    iVar1 = face->internal->refcount;
    face->internal->refcount = iVar1 + -1;
    if (iVar1 < 2) {
      pFVar4 = FT_List_Find(&driver->faces_list,face);
      if (pFVar4 == (FT_ListNode)0x0) {
        return 0x23;
      }
      memory = (driver->root).memory;
      pFVar2 = pFVar4->prev;
      pFVar3 = pFVar4->next;
      pFVar5 = (FT_ListRec *)&pFVar2->next;
      if (pFVar2 == (FT_ListNode)0x0) {
        pFVar5 = &driver->faces_list;
      }
      pFVar5->head = pFVar3;
      pFVar6 = (FT_ListNode)&(driver->faces_list).tail;
      if (pFVar3 != (FT_ListNode)0x0) {
        pFVar6 = pFVar3;
      }
      pFVar6->prev = pFVar2;
      (*memory->free)(memory,pFVar4);
      destroy_face(memory,face,driver);
    }
    FVar7 = 0;
  }
  return FVar7;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Done_Face( FT_Face  face )
  {
    FT_Error     error;
    FT_Driver    driver;
    FT_Memory    memory;
    FT_ListNode  node;


    error = FT_ERR( Invalid_Face_Handle );
    if ( face && face->driver )
    {
      face->internal->refcount--;
      if ( face->internal->refcount > 0 )
        error = FT_Err_Ok;
      else
      {
        driver = face->driver;
        memory = driver->root.memory;

        /* find face in driver's list */
        node = FT_List_Find( &driver->faces_list, face );
        if ( node )
        {
          /* remove face object from the driver's list */
          FT_List_Remove( &driver->faces_list, node );
          FT_FREE( node );

          /* now destroy the object proper */
          destroy_face( memory, face, driver );
          error = FT_Err_Ok;
        }
      }
    }

    return error;
  }